

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void idtx32x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  __m128i *palVar1;
  __m128i *palVar2;
  int iVar3;
  int iVar4;
  longlong lVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  
  lVar8 = 0;
  bVar6 = true;
  do {
    bVar7 = bVar6;
    palVar1 = in + lVar8;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    palVar1 = in + lVar8 + 8;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 8;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    palVar1 = in + lVar8 + 0x10;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0x10;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    palVar1 = in + lVar8 + 0x18;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0x18;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    palVar1 = in + lVar8 + 0x20;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0x20;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    palVar1 = in + lVar8 + 0x28;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0x28;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    palVar1 = in + lVar8 + 0x30;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0x30;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    palVar1 = in + lVar8 + 0x38;
    iVar3 = *(int *)((long)*palVar1 + 4);
    lVar5 = (*palVar1)[1];
    iVar4 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0x38;
    *(int *)*palVar2 = (int)(*palVar1)[0] * 2;
    *(int *)((long)*palVar2 + 4) = iVar3 * 2;
    *(int *)(*palVar2 + 1) = (int)lVar5 * 2;
    *(int *)((long)*palVar2 + 0xc) = iVar4 * 2;
    lVar8 = 1;
    bVar6 = false;
  } while (bVar7);
  return;
}

Assistant:

static void idtx32x8_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;
  (void)col_num;
  for (int j = 0; j < 2; j++) {
    out[j + 8 * 0] = _mm_add_epi32(in[j + 8 * 0], in[j + 8 * 0]);
    out[j + 8 * 1] = _mm_add_epi32(in[j + 8 * 1], in[j + 8 * 1]);
    out[j + 8 * 2] = _mm_add_epi32(in[j + 8 * 2], in[j + 8 * 2]);
    out[j + 8 * 3] = _mm_add_epi32(in[j + 8 * 3], in[j + 8 * 3]);
    out[j + 8 * 4] = _mm_add_epi32(in[j + 8 * 4], in[j + 8 * 4]);
    out[j + 8 * 5] = _mm_add_epi32(in[j + 8 * 5], in[j + 8 * 5]);
    out[j + 8 * 6] = _mm_add_epi32(in[j + 8 * 6], in[j + 8 * 6]);
    out[j + 8 * 7] = _mm_add_epi32(in[j + 8 * 7], in[j + 8 * 7]);
  }
}